

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::FastFieldValuePrinter::PrintFloat
          (FastFieldValuePrinter *this,float val,BaseTextGenerator *generator)

{
  ulong uVar1;
  uint uVar2;
  string *in_RSI;
  bool bVar3;
  uint in_XMM0_Da;
  BaseTextGenerator *in_stack_ffffffffffffffb0;
  allocator local_39;
  string local_38 [36];
  
  unique0x100000d5 = in_RSI;
  uVar2 = std::isnan((double)(ulong)in_XMM0_Da);
  bVar3 = (uVar2 & 1) != 0;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"nan",&local_39);
  }
  else {
    uVar1 = (ulong)stack0xffffffffffffffe8 >> 0x20;
    SimpleFtoa_abi_cxx11_((float)uVar1);
  }
  BaseTextGenerator::PrintString(in_stack_ffffffffffffffb0,in_RSI);
  std::__cxx11::string::~string(local_38);
  if (bVar3) {
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return;
}

Assistant:

void TextFormat::FastFieldValuePrinter::PrintFloat(
    float val, BaseTextGenerator* generator) const {
  generator->PrintString(!std::isnan(val) ? SimpleFtoa(val) : "nan");
}